

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodyOwnMass.cpp
# Opt level: O3

void __thiscall chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(ChVariablesBodyOwnMass *this)

{
  undefined1 auVar1 [16];
  
  ChVariables::ChVariables((ChVariables *)this,6);
  (this->super_ChVariablesBody).user_data = (void *)0x0;
  auVar1 = ZEXT816(0) << 0x40;
  (this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables =
       (_func_int **)&PTR__ChVariables_00b3ba88;
  *(undefined1 (*) [32])
   ((this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       ZEXT1632(auVar1);
  *(undefined1 (*) [32])
   ((this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 4) =
       ZEXT1632(auVar1);
  (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  this->mass = 1.0;
  *(undefined1 (*) [32])
   ((this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       ZEXT1632(auVar1);
  *(undefined1 (*) [32])
   ((this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 4) =
       ZEXT1632(auVar1);
  (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  this->inv_mass = 1.0;
  return;
}

Assistant:

ChVariablesBodyOwnMass::ChVariablesBodyOwnMass() : mass(1), inv_mass(1), inertia(1), inv_inertia(1) {}